

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_cpp.cpp
# Opt level: O0

void mfb_stub::char_input_stub(mfb_window *window,uint code)

{
  uint in_ESI;
  mfb_window *in_RDI;
  mfb_stub *stub;
  mfb_window *in_stack_00000028;
  
  GetInstance(in_stack_00000028);
  std::function<void_(mfb_window_*,_unsigned_int)>::operator()
            ((function<void_(mfb_window_*,_unsigned_int)> *)stub,in_RDI,in_ESI);
  return;
}

Assistant:

void 
mfb_stub::char_input_stub(struct mfb_window *window, unsigned int code) {
    mfb_stub    *stub = mfb_stub::GetInstance(window);
    stub->m_char_input(window, code);
}